

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformParentToLocal
          (ChCoordsys<double> *this,ChVector<double> *parent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ChVector<double> *in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  dVar1 = (this->rot).m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  dVar2 = (this->rot).m_data[2];
  dVar3 = (this->rot).m_data[1];
  dVar4 = (this->rot).m_data[3];
  auVar27 = ZEXT816(0x4000000000000000);
  dVar6 = parent->m_data[1] - (this->pos).m_data[1];
  dVar7 = parent->m_data[0] - (this->pos).m_data[0];
  dVar8 = parent->m_data[2] - (this->pos).m_data[2];
  dVar1 = dVar1 * dVar1;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar18,auVar11);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2 * dVar2 + dVar1;
  auVar12 = vfmadd213sd_avx512f(auVar25,auVar27,ZEXT816(0xbff0000000000000));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 + dVar3 * dVar3;
  auVar13 = vfmadd213sd_avx512f(auVar23,auVar27,ZEXT816(0xbff0000000000000));
  dVar17 = auVar11._0_8_;
  dVar9 = dVar3 * dVar2 - dVar4 * dVar17;
  dVar5 = dVar3 * dVar2 + dVar4 * dVar17;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5 + dVar5;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar12._0_8_ * dVar6;
  auVar11 = vfmadd231sd_fma(auVar26,auVar14,auVar19);
  dVar10 = dVar4 * dVar2 - dVar3 * dVar17;
  dVar5 = dVar3 * dVar17 + dVar4 * dVar2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (dVar9 + dVar9) * dVar6;
  auVar12 = vfmadd231sd_fma(auVar28,auVar14,auVar13);
  dVar9 = dVar2 * dVar17 + dVar4 * dVar3;
  dVar2 = dVar4 * dVar3 - dVar2 * dVar17;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar10 + dVar10;
  auVar11 = vfmadd213sd_fma(auVar20,auVar16,auVar11);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar7;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6 * (dVar5 + dVar5);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2 + dVar2;
  auVar13 = vfmadd231sd_fma(auVar15,auVar13,auVar21);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar9 + dVar9;
  auVar12 = vfmadd213sd_fma(auVar24,auVar16,auVar12);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar4 * dVar4 + dVar1;
  auVar14 = vfmadd213sd_avx512f(auVar22,auVar27,ZEXT816(0xbff0000000000000));
  in_RDI->m_data[0] = auVar12._0_8_;
  in_RDI->m_data[1] = auVar11._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar8;
  auVar11 = vfmadd213sd_fma(auVar14,auVar12,auVar13);
  in_RDI->m_data[2] = auVar11._0_8_;
  return in_RDI;
}

Assistant:

inline ChVector<Real> ChQuaternion<Real>::RotateBack(const ChVector<Real>& A) const {
    Real e0e0 = +m_data[0] * m_data[0];
    Real e1e1 = +m_data[1] * m_data[1];
    Real e2e2 = +m_data[2] * m_data[2];
    Real e3e3 = +m_data[3] * m_data[3];
    Real e0e1 = -m_data[0] * m_data[1];
    Real e0e2 = -m_data[0] * m_data[2];
    Real e0e3 = -m_data[0] * m_data[3];
    Real e1e2 = +m_data[1] * m_data[2];
    Real e1e3 = +m_data[1] * m_data[3];
    Real e2e3 = +m_data[2] * m_data[3];
    return ChVector<Real>(((e0e0 + e1e1) * 2 - 1) * A.x() + ((e1e2 - e0e3) * 2) * A.y() + ((e1e3 + e0e2) * 2) * A.z(),
                          ((e1e2 + e0e3) * 2) * A.x() + ((e0e0 + e2e2) * 2 - 1) * A.y() + ((e2e3 - e0e1) * 2) * A.z(),
                          ((e1e3 - e0e2) * 2) * A.x() + ((e2e3 + e0e1) * 2) * A.y() + ((e0e0 + e3e3) * 2 - 1) * A.z());
}